

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall PFData_test_dist_lw_nldas_Test::TestBody(PFData_test_dist_lw_nldas_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  FILE *this_00;
  FILE *message;
  size_t sVar4;
  char *pcVar5;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int result;
  AssertionResult gtest_ar_5;
  int retval2;
  int retval1;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  FILE *f2;
  FILE *f1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  PFData test2;
  PFData test;
  char buf2 [1024];
  char buf1 [1024];
  undefined7 in_stack_fffffffffffff3a0;
  undefined1 in_stack_fffffffffffff3a7;
  _IO_FILE **in_stack_fffffffffffff3a8;
  undefined7 in_stack_fffffffffffff3b0;
  undefined1 in_stack_fffffffffffff3b7;
  undefined1 uVar6;
  char *in_stack_fffffffffffff3b8;
  int line;
  undefined7 in_stack_fffffffffffff3c0;
  undefined1 in_stack_fffffffffffff3c7;
  string *in_stack_fffffffffffff3c8;
  Type type;
  undefined7 in_stack_fffffffffffff3d0;
  undefined1 in_stack_fffffffffffff3d7;
  PFData *in_stack_fffffffffffff3d8;
  Message *in_stack_fffffffffffff418;
  AssertHelper *in_stack_fffffffffffff420;
  PFData *in_stack_fffffffffffff478;
  AssertionResult local_b78 [2];
  int local_b58;
  undefined4 local_b54;
  AssertionResult local_b50 [2];
  undefined4 local_b2c;
  AssertionResult local_b28 [2];
  undefined4 local_b04;
  AssertionResult local_b00;
  int local_aec;
  AssertionResult local_ad8;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined8 local_ab0;
  AssertionResult local_aa8 [2];
  undefined8 local_a88;
  AssertionResult local_a80;
  FILE *local_a70;
  FILE *local_a68;
  int local_a50;
  undefined4 local_a4c;
  AssertionResult local_a48 [2];
  int local_a28;
  undefined4 local_a24;
  AssertionResult local_a20;
  uint local_a0c;
  int local_9f8;
  undefined4 local_9f4;
  AssertionResult local_9f0;
  allocator local_9d9;
  string local_9d8 [56];
  string *in_stack_fffffffffffff660;
  int in_stack_fffffffffffff66c;
  int in_stack_fffffffffffff670;
  int in_stack_fffffffffffff674;
  PFData *in_stack_fffffffffffff678;
  allocator local_909;
  string local_908 [55];
  allocator local_8d1;
  string local_8d0 [200];
  undefined1 local_808 [1024];
  undefined1 local_408 [1032];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"tests/inputs/NLDAS.APCP.000001_to_000024.pfb",&local_8d1);
  PFData::PFData((PFData *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
                 in_stack_fffffffffffff3c8);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_908,"tests/NLDAS.APCP.000001_to_000024.pfb",&local_909);
  PFData::distFile(in_stack_fffffffffffff678,in_stack_fffffffffffff674,in_stack_fffffffffffff670,
                   in_stack_fffffffffffff66c,in_stack_fffffffffffff660);
  std::__cxx11::string::~string(local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d8,"tests/NLDAS.APCP.000001_to_000024.pfb",&local_9d9);
  PFData::PFData((PFData *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
                 in_stack_fffffffffffff3c8);
  type = (Type)((ulong)in_stack_fffffffffffff3c8 >> 0x20);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  PFData::loadHeader(in_stack_fffffffffffff478);
  PFData::loadPQR(in_stack_fffffffffffff3d8);
  local_9f4 = 1;
  local_9f8 = PFData::getR((PFData *)(local_9d8 + 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff3b8,
             (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
             (int *)in_stack_fffffffffffff3a8,
             (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0));
    testing::AssertionResult::failure_message((AssertionResult *)0x122f45);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),type,
               (char *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
               (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    testing::Message::~Message((Message *)0x122fa8);
  }
  local_a0c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123016);
  if (local_a0c == 0) {
    local_a24 = 2;
    local_a28 = PFData::getQ((PFData *)(local_9d8 + 0x20));
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffff3b8,
               (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
               (int *)in_stack_fffffffffffff3a8,
               (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a20);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0));
      testing::AssertionResult::failure_message((AssertionResult *)0x1230f2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),type,
                 (char *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                 (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
      testing::Message::~Message((Message *)0x123155);
    }
    local_a0c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1231c3);
    if (local_a0c == 0) {
      local_a4c = 2;
      local_a50 = PFData::getP((PFData *)(local_9d8 + 0x20));
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffff3b8,
                 (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
                 (int *)in_stack_fffffffffffff3a8,
                 (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a48);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0));
        testing::AssertionResult::failure_message((AssertionResult *)0x12329f);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
                   type,(char *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                   (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
        testing::Message::~Message((Message *)0x123302);
      }
      local_a0c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x123370);
      if (local_a0c == 0) {
        this_00 = fopen("tests/inputs/NLDAS.APCP.000001_to_000024.pfb","rb");
        local_a68 = this_00;
        message = fopen("tests/NLDAS.APCP.000001_to_000024.pfb","rb");
        local_a88 = 0;
        local_a70 = message;
        testing::internal::CmpHelperNE<_IO_FILE*,decltype(nullptr)>
                  (in_stack_fffffffffffff3b8,
                   (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
                   in_stack_fffffffffffff3a8,
                   (void **)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a80);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0));
          testing::AssertionResult::failure_message((AssertionResult *)0x12347d);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
                     type,(char *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                     (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
          testing::Message::~Message((Message *)0x1234da);
        }
        local_a0c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x123548);
        if (local_a0c == 0) {
          local_ab0 = 0;
          testing::internal::CmpHelperNE<_IO_FILE*,decltype(nullptr)>
                    (in_stack_fffffffffffff3b8,
                     (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
                     in_stack_fffffffffffff3a8,
                     (void **)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_aa8);
          if (!bVar1) {
            testing::Message::Message
                      ((Message *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0));
            testing::AssertionResult::failure_message((AssertionResult *)0x1235fb);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0)
                       ,type,(char *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                       (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
            testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0)
                      );
            testing::Message::~Message((Message *)0x123658);
          }
          local_a0c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1236c6);
          if (local_a0c == 0) {
            sVar4 = fread(local_408,1,0x40,local_a68);
            local_ac4 = (undefined4)sVar4;
            sVar4 = fread(local_808,1,0x40,local_a70);
            local_ac8 = (undefined4)sVar4;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      (in_stack_fffffffffffff3b8,
                       (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
                       (int *)in_stack_fffffffffffff3a8,
                       (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ad8);
            if (!bVar1) {
              testing::Message::Message
                        ((Message *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0));
              testing::AssertionResult::failure_message((AssertionResult *)0x1237d1);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),type,
                         (char *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                         (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
              testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message)
              ;
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
              testing::Message::~Message((Message *)0x12382e);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x123886);
            local_aec = memcmp(local_408,local_808,0x3e);
            local_b04 = 0;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      (in_stack_fffffffffffff3b8,
                       (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
                       (int *)in_stack_fffffffffffff3a8,
                       (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b00);
            if (!(bool)uVar2) {
              testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff3d0));
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x123948);
              type = (Type)((ulong)pcVar5 >> 0x20);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff3d0),type,
                         (char *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                         (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
              testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message)
              ;
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
              testing::Message::~Message((Message *)0x1239a5);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1239fd);
            local_aec = memcmp(local_408,local_808,0x40);
            local_b2c = 0;
            testing::internal::CmpHelperNE<int,int>
                      (in_stack_fffffffffffff3b8,
                       (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
                       (int *)in_stack_fffffffffffff3a8,
                       (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            uVar3 = testing::AssertionResult::operator_cast_to_bool(local_b28);
            if (!(bool)uVar3) {
              testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff3d0));
              in_stack_fffffffffffff3b8 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x123abf);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff3d0),type,
                         (char *)CONCAT17(uVar3,in_stack_fffffffffffff3c0),
                         (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
              testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message)
              ;
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
              testing::Message::~Message((Message *)0x123b1c);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x123b74);
            fclose(local_a68);
            fclose(local_a70);
            local_b54 = 0;
            local_b58 = remove("tests/NLDAS.APCP.000001_to_000024.pfb.dist");
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      (in_stack_fffffffffffff3b8,
                       (char *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0),
                       (int *)in_stack_fffffffffffff3a8,
                       (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b50);
            uVar6 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff3d0));
              in_stack_fffffffffffff3a8 =
                   (_IO_FILE **)
                   testing::AssertionResult::failure_message((AssertionResult *)0x123c46);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff3d0),type,
                         (char *)CONCAT17(uVar3,in_stack_fffffffffffff3c0),
                         (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                         (char *)CONCAT17(uVar6,in_stack_fffffffffffff3b0));
              testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message)
              ;
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
              testing::Message::~Message((Message *)0x123ca3);
            }
            local_a0c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x123d11);
            if (local_a0c == 0) {
              remove("tests/NLDAS.APCP.000001_to_000024.pfb");
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        (in_stack_fffffffffffff3b8,(char *)CONCAT17(uVar6,in_stack_fffffffffffff3b0)
                         ,(int *)in_stack_fffffffffffff3a8,
                         (int *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
              line = (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b78);
              in_stack_fffffffffffff3a7 = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff3d0));
                testing::AssertionResult::failure_message((AssertionResult *)0x123dd6);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff3d0),type,
                           (char *)CONCAT17(uVar3,in_stack_fffffffffffff3c0),line,
                           (char *)CONCAT17(uVar6,in_stack_fffffffffffff3b0));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)this_00,(Message *)message);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
                testing::Message::~Message((Message *)0x123e31);
              }
              local_a0c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x123e9c);
              if (local_a0c == 0) {
                local_a0c = 0;
              }
            }
          }
        }
      }
    }
  }
  PFData::~PFData((PFData *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
  PFData::~PFData((PFData *)CONCAT17(in_stack_fffffffffffff3a7,in_stack_fffffffffffff3a0));
  return;
}

Assistant:

TEST_F(PFData_test, dist_lw_nldas){
    char buf1[1024];
    char buf2[1024];

    PFData test("tests/inputs/NLDAS.APCP.000001_to_000024.pfb");
    test.distFile(2,2,1,"tests/NLDAS.APCP.000001_to_000024.pfb");

    //Also test loadPQR
    PFData test2("tests/NLDAS.APCP.000001_to_000024.pfb");
    test2.loadHeader();
    test2.loadPQR();
    ASSERT_EQ(1, test2.getR());
    ASSERT_EQ(2, test2.getQ());
    ASSERT_EQ(2, test2.getP());

    FILE* f1 = fopen("tests/inputs/NLDAS.APCP.000001_to_000024.pfb","rb");
    FILE* f2 = fopen("tests/NLDAS.APCP.000001_to_000024.pfb","rb");
    ASSERT_NE(f1,nullptr);
    ASSERT_NE(f2,nullptr);
    int retval1 = fread(buf1,1,64,f1);
    int retval2 = fread(buf2,1,64,f2);
    EXPECT_EQ(retval1,retval2);
    int result = memcmp(buf1,buf2,62);
    EXPECT_EQ(0,result);
    result = memcmp(buf1,buf2,64);
    EXPECT_NE(0,result);
    fclose(f1);
    fclose(f2);


    ASSERT_EQ(0,remove("tests/NLDAS.APCP.000001_to_000024.pfb.dist"));
    ASSERT_EQ(0,remove("tests/NLDAS.APCP.000001_to_000024.pfb"));

}